

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O1

double __thiscall PerlinNoise::noise(PerlinNoise *this,double x,double y,double z)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer piVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  
  dVar13 = floor(x);
  dVar14 = floor(y);
  dVar15 = floor(z);
  uVar10 = (ulong)((int)dVar15 & 0xff);
  dVar27 = x - dVar13;
  dVar22 = y - dVar14;
  dVar15 = z - dVar15;
  piVar9 = (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar11 = (long)piVar9[(int)dVar13 & 0xff] + (ulong)((int)dVar14 & 0xff);
  lVar12 = (long)piVar9[(ulong)((int)dVar13 & 0xff) + 1] + (ulong)((int)dVar14 & 0xff);
  uVar1 = piVar9[(long)piVar9[lVar11] + uVar10];
  dVar13 = dVar22;
  if ((3 < (uVar1 & 0xf)) && (dVar13 = dVar27, (uVar1 & 0xd) != 0xc)) {
    dVar13 = dVar15;
  }
  uVar2 = piVar9[(long)piVar9[lVar12] + uVar10];
  dVar21 = dVar27 + -1.0;
  dVar14 = dVar22;
  if ((3 < (uVar2 & 0xf)) && (dVar14 = dVar21, (uVar2 & 0xd) != 0xc)) {
    dVar14 = dVar15;
  }
  uVar3 = piVar9[(long)piVar9[(long)(int)lVar11 + 1] + uVar10];
  dVar25 = dVar22 + -1.0;
  dVar17 = dVar25;
  if ((3 < (uVar3 & 0xf)) && (dVar17 = dVar27, (uVar3 & 0xd) != 0xc)) {
    dVar17 = dVar15;
  }
  uVar4 = piVar9[(long)piVar9[(long)(int)lVar12 + 1] + uVar10];
  dVar23 = dVar25;
  if ((3 < (uVar4 & 0xf)) && (dVar23 = dVar21, (uVar4 & 0xd) != 0xc)) {
    dVar23 = dVar15;
  }
  uVar5 = piVar9[(long)(int)((long)piVar9[lVar11] + uVar10) + 1];
  dVar16 = dVar15 + -1.0;
  dVar29 = dVar22;
  if ((3 < (uVar5 & 0xf)) && (dVar29 = dVar27, (uVar5 & 0xd) != 0xc)) {
    dVar29 = dVar16;
  }
  uVar6 = piVar9[(long)(int)((long)piVar9[lVar12] + uVar10) + 1];
  dVar30 = dVar22;
  if ((3 < (uVar6 & 0xf)) && (dVar30 = dVar21, (uVar6 & 0xd) != 0xc)) {
    dVar30 = dVar16;
  }
  uVar7 = piVar9[(long)(int)((long)piVar9[(long)(int)lVar11 + 1] + uVar10) + 1];
  dVar19 = dVar25;
  if ((3 < (uVar7 & 0xf)) && (dVar19 = dVar27, (uVar7 & 0xd) != 0xc)) {
    dVar19 = dVar16;
  }
  uVar8 = piVar9[(long)(int)((long)piVar9[(long)(int)lVar12 + 1] + uVar10) + 1];
  dVar24 = dVar25;
  if ((3 < (uVar8 & 0xf)) && (dVar24 = dVar21, (uVar8 & 0xd) != 0xc)) {
    dVar24 = dVar16;
  }
  dVar16 = dVar27;
  if (7 < (uVar7 & 0xf)) {
    dVar16 = dVar25;
  }
  if ((uVar7 & 1) != 0) {
    dVar16 = -dVar16;
  }
  if ((uVar7 & 2) != 0) {
    dVar19 = -dVar19;
  }
  dVar28 = dVar21;
  if (7 < (uVar6 & 0xf)) {
    dVar28 = dVar22;
  }
  if ((uVar6 & 1) != 0) {
    dVar28 = -dVar28;
  }
  if ((uVar6 & 2) != 0) {
    dVar30 = -dVar30;
  }
  dVar32 = dVar27;
  if (7 < (uVar5 & 0xf)) {
    dVar32 = dVar22;
  }
  if ((uVar5 & 1) != 0) {
    dVar32 = -dVar32;
  }
  if ((uVar5 & 2) != 0) {
    dVar29 = -dVar29;
  }
  dVar31 = dVar21;
  if (7 < (uVar4 & 0xf)) {
    dVar31 = dVar25;
  }
  if ((uVar4 & 1) != 0) {
    dVar31 = -dVar31;
  }
  if ((uVar4 & 2) != 0) {
    dVar23 = -dVar23;
  }
  dVar26 = dVar27;
  if (7 < (uVar3 & 0xf)) {
    dVar26 = dVar25;
  }
  if ((uVar3 & 1) != 0) {
    dVar26 = -dVar26;
  }
  if ((uVar3 & 2) != 0) {
    dVar17 = -dVar17;
  }
  dVar20 = dVar21;
  if (7 < (uVar2 & 0xf)) {
    dVar20 = dVar22;
  }
  if ((uVar2 & 1) != 0) {
    dVar20 = -dVar20;
  }
  if ((uVar2 & 2) != 0) {
    dVar14 = -dVar14;
  }
  dVar18 = dVar27 * dVar27 * dVar27 * ((dVar27 * 6.0 + -15.0) * dVar27 + 10.0);
  if (7 < (uVar1 & 0xf)) {
    dVar27 = dVar22;
  }
  if ((uVar1 & 1) != 0) {
    dVar27 = -dVar27;
  }
  if ((uVar1 & 2) != 0) {
    dVar13 = -dVar13;
  }
  dVar22 = dVar22 * dVar22 * dVar22 * ((dVar22 * 6.0 + -15.0) * dVar22 + 10.0);
  dVar13 = ((dVar20 + dVar14) - (dVar27 + dVar13)) * dVar18 + dVar27 + dVar13;
  if (7 < (uVar8 & 0xf)) {
    dVar21 = dVar25;
  }
  if ((uVar8 & 1) != 0) {
    dVar21 = -dVar21;
  }
  dVar27 = ((dVar28 + dVar30) - (dVar32 + dVar29)) * dVar18 + dVar32 + dVar29;
  dVar13 = ((((dVar31 + dVar23) - (dVar26 + dVar17)) * dVar18 + dVar26 + dVar17) - dVar13) * dVar22
           + dVar13;
  if ((uVar8 & 2) != 0) {
    dVar24 = -dVar24;
  }
  return (dVar15 * dVar15 * dVar15 * ((dVar15 * 6.0 + -15.0) * dVar15 + 10.0) *
          ((dVar22 * ((dVar18 * ((dVar21 + dVar24) - (dVar16 + dVar19)) + dVar16 + dVar19) - dVar27)
           + dVar27) - dVar13) + dVar13 + 1.0) * 0.5;
}

Assistant:

double PerlinNoise::noise(double x, double y, double z) {
    // Find the unit cube that contains the point
    int X = (int) floor(x) & 255;
    int Y = (int) floor(y) & 255;
    int Z = (int) floor(z) & 255;

    // Find relative x, y,z of point in cube
    x -= floor(x);
    y -= floor(y);
    z -= floor(z);

    // Compute fade curves for each of x, y, z
    double u = fade(x);
    double v = fade(y);
    double w = fade(z);

    // Hash coordinates of the 8 cube corners
    int A = p[X] + Y;
    int AA = p[A] + Z;
    int AB = p[A + 1] + Z;
    int B = p[X + 1] + Y;
    int BA = p[B] + Z;
    int BB = p[B + 1] + Z;

    // Add blended results from 8 corners of cube
    double res = 
        lerp(w,
            lerp(v,
                lerp(u,
                    grad(p[AA], x, y, z),
                    grad(p[BA], x-1, y, z)),
                lerp(u,
                    grad(p[AB], x, y-1, z),
                    grad(p[BB], x-1, y-1, z))),
            lerp(v,
                lerp(u,
                    grad(p[AA+1],x, y, z-1),
                    grad(p[BA+1], x-1, y, z-1)),
                lerp(u, grad(p[AB+1], x, y-1, z-1),
                    grad(p[BB+1], x-1, y-1, z-1))));

    return (res + 1.0) / 2.0;
}